

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

void __thiscall
duckdb::StrfTimeFormat::FormatStringNS
          (StrfTimeFormat *this,date_t date,int32_t *data,char *tz_name,char *target)

{
  vector<duckdb::StrTimeSpecifier,_true> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_01;
  pointer pSVar1;
  pointer pSVar2;
  pointer __src;
  size_type sVar3;
  const_reference cVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  size_t tz_len;
  StrfTimeFormat *pSVar7;
  ulong __n;
  
  this_00 = &(this->super_StrTimeFormat).specifiers;
  this_01 = &(this->super_StrTimeFormat).literals;
  __n = 0;
  while( true ) {
    pSVar1 = (this->super_StrTimeFormat).specifiers.
             super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
             super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pSVar2 = (this->super_StrTimeFormat).specifiers.
             super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
             super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(this_01,__n);
    __src = (pvVar5->_M_dataplus)._M_p;
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(this_01,__n);
    switchD_0193dc74::default(target,__src,pvVar5->_M_string_length);
    if ((ulong)((long)pSVar1 - (long)pSVar2) <= __n) break;
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(this_01,__n);
    sVar3 = pvVar5->_M_string_length;
    cVar4 = vector<bool,_true>::get<true>(&this->is_date_specifier,__n);
    if (cVar4) {
      pSVar7 = (StrfTimeFormat *)this_00;
      pvVar6 = vector<duckdb::StrTimeSpecifier,_true>::get<true>(this_00,__n);
      target = WriteDateSpecifier(pSVar7,*pvVar6,date,target + sVar3);
    }
    else {
      if (tz_name == (char *)0x0) {
        tz_len = 0;
      }
      else {
        tz_len = strlen(tz_name);
      }
      pSVar7 = (StrfTimeFormat *)this_00;
      pvVar6 = vector<duckdb::StrTimeSpecifier,_true>::get<true>(this_00,__n);
      target = WriteStandardSpecifier(pSVar7,*pvVar6,data,tz_name,tz_len,target + sVar3);
    }
    __n = __n + 1;
  }
  return;
}

Assistant:

void StrfTimeFormat::FormatStringNS(date_t date, int32_t data[8], const char *tz_name, char *target) const {
	D_ASSERT(specifiers.size() + 1 == literals.size());
	idx_t i;
	for (i = 0; i < specifiers.size(); i++) {
		// first copy the current literal
		memcpy(target, literals[i].c_str(), literals[i].size());
		target += literals[i].size();
		// now copy the specifier
		if (is_date_specifier[i]) {
			target = WriteDateSpecifier(specifiers[i], date, target);
		} else {
			auto tz_len = tz_name ? strlen(tz_name) : 0;
			target = WriteStandardSpecifier(specifiers[i], data, tz_name, tz_len, target);
		}
	}
	// copy the final literal into the target
	memcpy(target, literals[i].c_str(), literals[i].size());
}